

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

int ReadLine(bool SplitByColon)

{
  uint32_t uVar1;
  CStringsList *pCVar2;
  bool bVar3;
  reference pvVar4;
  int local_c;
  bool SplitByColon_local;
  
  if ((IsRunning == 0) || (lijst == 0)) {
    local_c = ReadLineNoMacro(SplitByColon);
  }
  else if ((lijstp == (CStringsList *)0x0) || (lijstp->string == (char *)0x0)) {
    local_c = 0;
  }
  else {
    bVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack);
    pCVar2 = lijstp;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!sourcePosStack.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                    ,0x50d,"int ReadLine(bool)");
    }
    pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    pvVar4->filename = (pCVar2->source).filename;
    uVar1 = (pCVar2->source).colBegin;
    pvVar4->line = (pCVar2->source).line;
    pvVar4->colBegin = uVar1;
    pvVar4->colEnd = (pCVar2->source).colEnd;
    strcpy(line,lijstp->string);
    substitutedLine = line;
    eolComment = (char *)0x0;
    lijstp = lijstp->next;
    local_c = 1;
  }
  return local_c;
}

Assistant:

int ReadLine(bool SplitByColon) {
	if (IsRunning && lijst) {		// read MACRO lines, if macro is being emitted
		if (!lijstp || !lijstp->string) return 0;
		assert(!sourcePosStack.empty());
		sourcePosStack.back() = lijstp->source;
		STRCPY(line, LINEMAX, lijstp->string);
		substitutedLine = line;		// reset substituted listing
		eolComment = NULL;			// reset end of line comment
		lijstp = lijstp->next;
		return 1;
	}
	return ReadLineNoMacro(SplitByColon);
}